

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

void PaUtil_SetInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint uVar1;
  uint channel;
  ulong uVar2;
  uint uVar3;
  
  if (channelCount == 0) {
    channelCount = bp->outputChannelCount;
  }
  if (channelCount != 0) {
    uVar1 = bp->bytesPerHostOutputSample;
    uVar2 = 0;
    do {
      uVar3 = firstChannel + (int)uVar2;
      bp->hostOutputChannels[0][uVar3].data = data;
      bp->hostOutputChannels[0][uVar3].stride = channelCount;
      data = (void *)((long)data + (ulong)uVar1);
      uVar2 = uVar2 + 1;
    } while (channelCount != uVar2);
  }
  return;
}

Assistant:

void PaUtil_SetInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );
    
    for( i=0; i< channelCount; ++i )
    {
        PaUtil_SetOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}